

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O1

bool __thiscall
ObjectModelBuilder::buildMaybeClass(ObjectModelBuilder *this,value *value,bool declaration)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  
  if (value->type_ == 5) {
    bVar1 = buildClass(this,(object *)(value->u_).string_,declaration);
    return bVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: class",0xc);
  pcVar3 = "";
  lVar2 = 0;
  if (declaration) {
    pcVar3 = " declaration";
    lVar2 = 0xc;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,lVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr," is not a JSON object..",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  return false;
}

Assistant:

bool ObjectModelBuilder::buildMaybeClass(const picojson::value &value, bool declaration)
{
    if (!value.is<picojson::object>()) {
        std::cerr << "error: class" << (declaration ? " declaration" : "") << " is not a JSON object.." << std::endl;
        return false;
    }
    return buildClass(value.get<picojson::object>(), declaration);
}